

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

size_t M_GetClmDim(Matrix *M)

{
  LASErrIdType LVar1;
  size_t sVar2;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    sVar2 = M->ClmDim;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t M_GetClmDim(Matrix *M)
/* returns the column dimension of the matrix M */
{
    size_t Dim;

    if (LASResult() == LASOK)
        Dim = M->ClmDim;
    else
        Dim = 0;
    return(Dim);
}